

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

double __thiscall
fasttext::Autotune::getMetricScore
          (Autotune *this,Meter *meter,metric_name *metricName,double metricValue,
          string *metricLabel)

{
  int32_t iVar1;
  ulong uVar2;
  runtime_error *prVar3;
  int *in_RDX;
  double in_stack_00000020;
  int32_t in_stack_0000002c;
  Meter *in_stack_00000030;
  int32_t labelId;
  double score;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  Meter *in_stack_ffffffffffffffa0;
  Meter *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb8;
  FastText *in_stack_ffffffffffffffc0;
  double local_30;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (iVar1 = FastText::getLabelId(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), iVar1 == -1
     )) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Unknown autotune metric label");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*in_RDX == 1) {
    local_30 = Meter::f1Score(in_stack_ffffffffffffffa8);
  }
  else if (*in_RDX == 2) {
    local_30 = Meter::f1Score(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  else if (*in_RDX == 3) {
    local_30 = Meter::precisionAtRecall
                         (in_stack_ffffffffffffffa0,
                          (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else if (*in_RDX == 4) {
    local_30 = Meter::precisionAtRecall(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  }
  else if (*in_RDX == 5) {
    local_30 = Meter::recallAtPrecision
                         (in_stack_ffffffffffffffa0,
                          (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    if (*in_RDX != 6) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Unknown metric");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_30 = Meter::recallAtPrecision(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  }
  return local_30;
}

Assistant:

double Autotune::getMetricScore(
    Meter& meter,
    const metric_name& metricName,
    const double metricValue,
    const std::string& metricLabel) const {
  double score = 0.0;
  int32_t labelId = -1;
  if (!metricLabel.empty()) {
    labelId = fastText_->getLabelId(metricLabel);
    if (labelId == -1) {
      throw std::runtime_error("Unknown autotune metric label");
    }
  }
  if (metricName == metric_name::f1score) {
    score = meter.f1Score();
  } else if (metricName == metric_name::f1scoreLabel) {
    score = meter.f1Score(labelId);
  } else if (metricName == metric_name::precisionAtRecall) {
    score = meter.precisionAtRecall(metricValue);
  } else if (metricName == metric_name::precisionAtRecallLabel) {
    score = meter.precisionAtRecall(labelId, metricValue);
  } else if (metricName == metric_name::recallAtPrecision) {
    score = meter.recallAtPrecision(metricValue);
  } else if (metricName == metric_name::recallAtPrecisionLabel) {
    score = meter.recallAtPrecision(labelId, metricValue);
  } else {
    throw std::runtime_error("Unknown metric");
  }
  return score;
}